

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O2

double __thiscall fasttext::Meter::log(Meter *this,double __x)

{
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *this_00;
  key_type *__k;
  uint64_t *puVar1;
  ulong uVar2;
  pointer piVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  mapped_type *pmVar6;
  ulong *in_RDX;
  const_iterator __end1;
  vector<int,_std::allocator<int>_> *in_RSI;
  const_iterator __begin1;
  ulong uVar7;
  int *label;
  pointer __k_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  this->nexamples_ = this->nexamples_ + 1;
  this_00 = &this->labelMetrics_;
  uVar2 = in_RDX[1];
  uVar7 = *in_RDX;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar2;
  auVar4 = vpunpcklqdq_avx(auVar8,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar7;
  auVar8 = vpunpcklqdq_avx(auVar11,auVar12);
  auVar4 = vpsubq_avx(auVar4,auVar8);
  auVar8 = vpsravq_avx512vl(auVar4,_DAT_00136690);
  auVar4._0_8_ = (this->metrics_).gold;
  auVar4._8_8_ = (this->metrics_).predicted;
  auVar4 = vpaddq_avx(auVar8,auVar4);
  auVar9 = ZEXT1664(auVar4);
  (this->metrics_).gold = auVar4._0_8_;
  (this->metrics_).predicted = auVar4._8_8_;
  for (; uVar7 != uVar2; uVar7 = uVar7 + 8) {
    __k = (key_type *)(uVar7 + 4);
    pmVar6 = std::__detail::
             _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k);
    pmVar6->predicted = pmVar6->predicted + 1;
    bVar5 = utils::contains<int>(in_RSI,__k);
    if (bVar5) {
      pmVar6 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,__k);
      pmVar6->predictedGold = pmVar6->predictedGold + 1;
      puVar1 = &(this->metrics_).predictedGold;
      *puVar1 = *puVar1 + 1;
    }
  }
  piVar3 = (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (__k_00 = (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; __k_00 != piVar3; __k_00 = __k_00 + 1) {
    pmVar6 = std::__detail::
             _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k_00);
    pmVar6->gold = pmVar6->gold + 1;
  }
  return auVar9._0_8_;
}

Assistant:

void Meter::log(
    const std::vector<int32_t>& labels,
    const Predictions& predictions) {
  nexamples_++;
  metrics_.gold += labels.size();
  metrics_.predicted += predictions.size();

  for (const auto& prediction : predictions) {
    labelMetrics_[prediction.second].predicted++;

    if (utils::contains(labels, prediction.second)) {
      labelMetrics_[prediction.second].predictedGold++;
      metrics_.predictedGold++;
    }
  }

  for (const auto& label : labels) {
    labelMetrics_[label].gold++;
  }
}